

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void golf_alloc_get_debug_info(size_t *total_size)

{
  _golf_alloc_info_t *p_Var1;
  _golf_alloc_info_t *p_Var2;
  size_t sVar3;
  
  golf_mutex_lock(&_alloc_lock);
  *total_size = 0;
  p_Var1 = head;
  p_Var2 = head->next;
  if (p_Var2 != head) {
    sVar3 = *total_size;
    do {
      sVar3 = sVar3 + p_Var2->size;
      *total_size = sVar3;
      p_Var2 = p_Var2->next;
    } while (p_Var2 != p_Var1);
  }
  golf_mutex_unlock(&_alloc_lock);
  return;
}

Assistant:

void golf_alloc_get_debug_info(size_t *total_size) {
    golf_mutex_lock(&_alloc_lock);
    *total_size = 0;
    _golf_alloc_info_t *info = head;
    while (info->next != head) {
        info = info->next;
        *total_size += info->size;
    }
    golf_mutex_unlock(&_alloc_lock);
}